

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O1

int UpnpSetWebServerCorsString(char *corsString)

{
  int iVar1;
  
  if (UpnpSdkInit == 0) {
    iVar1 = -0x74;
  }
  else {
    iVar1 = -0x65;
    if ((corsString != (char *)0x0) && (*corsString != '\0')) {
      membuffer_destroy(&gWebserverCorsString);
      iVar1 = web_server_set_cors(corsString);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

int UpnpSetWebServerCorsString(const char *corsString)
{
	if (UpnpSdkInit == 0)
		return UPNP_E_FINISH;
	if ((corsString == NULL) || (strlen(corsString) == 0)) {
		return UPNP_E_INVALID_PARAM;
	}

	membuffer_destroy(&gWebserverCorsString);

	return web_server_set_cors(corsString);
}